

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void __thiscall my_crc_basic::process_bit(my_crc_basic *this,bool bit)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,bit);
  if (uVar2 != 0) {
    uVar2 = this->high_bit_mask;
  }
  uVar2 = uVar2 ^ this->rem_;
  uVar1 = uVar2 * 2;
  this->rem_ = uVar1;
  if ((uVar2 & this->high_bit_mask) != 0) {
    this->rem_ = uVar1 ^ this->poly_;
  }
  return;
}

Assistant:

void my_crc_basic::process_bit (bool bit) {

  // compare the new bit with the remainder's highest
  rem_ ^= ( bit ? high_bit_mask : 0u );

  // a full polynominal division step is done when the highest bit is one
  bool const  do_poly_div = static_cast<bool>( rem_ & high_bit_mask );
  
  // shift out the highest bit
  rem_ <<= 1;
  
  // carry out the division, if needed
  if ( do_poly_div ) rem_ ^= poly_;
 
}